

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O2

bool __thiscall
QStringListModel::insertRows(QStringListModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  Data *local_48;
  char16_t *pcStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    iVar1 = (**(code **)(*(long *)this + 0x78))(this,parent);
    if (row <= iVar1) {
      local_48 = (Data *)0xffffffffffffffff;
      pcStack_40 = (char16_t *)0x0;
      tStack_38.ptr = (QAbstractItemModel *)0x0;
      QAbstractItemModel::beginInsertRows
                ((QAbstractItemModel *)this,(QModelIndex *)&local_48,row,row + count + -1);
      while (bVar2 = count != 0, count = count + -1, bVar2) {
        local_48 = (Data *)0x0;
        pcStack_40 = (char16_t *)0x0;
        tStack_38.ptr = (QAbstractItemModel *)0x0;
        QList<QString>::emplace<QString>
                  ((QList<QString> *)(this + 0x10),(ulong)(uint)row,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
      }
      QAbstractItemModel::endInsertRows((QAbstractItemModel *)this);
      bVar2 = true;
      goto LAB_0043342b;
    }
  }
  bVar2 = false;
LAB_0043342b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::insertRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || row > rowCount(parent))
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);

    for (int r = 0; r < count; ++r)
        lst.insert(row, QString());

    endInsertRows();

    return true;
}